

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Demiter(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Gia_Man_t *pGVar5;
  char *pcVar6;
  char *pcVar7;
  Gia_Man_t *pPart2;
  Gia_Man_t *pPart1;
  char pName1 [1000];
  char pName0 [1000];
  uint local_824;
  Gia_Man_t *local_820;
  Gia_Man_t *local_818;
  Abc_Frame_t *local_810;
  char local_808 [1008];
  char local_418 [1000];
  
  Extra_UtilGetoptReset();
  iVar4 = Extra_UtilGetopt(argc,argv,"ftdvh");
  if (iVar4 == -1) {
    pGVar5 = pAbc->pGia;
    if (pGVar5 != (Gia_Man_t *)0x0) {
      local_824 = 0;
      if (pGVar5->vCos->nSize - pGVar5->nRegs != 1) goto LAB_00290c6d;
      goto LAB_00290c0f;
    }
  }
  else {
    local_824 = 0;
    bVar3 = false;
    bVar2 = false;
    bVar1 = false;
    local_810 = pAbc;
    do {
      switch(iVar4 - 100U >> 1 | (uint)((iVar4 - 100U & 1) != 0) << 0x1f) {
      case 0:
        bVar3 = (bool)(bVar3 ^ 1);
        break;
      case 1:
        bVar1 = (bool)(bVar1 ^ 1);
        break;
      default:
        Abc_Print(-2,"usage: &demiter [-ftdvh]\n");
        Abc_Print(-2,"\t         decomposes a miter (by default, tries to extract an OR gate)\n");
        pcVar7 = "yes";
        pcVar6 = "yes";
        if (!bVar1) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-f     : write files with two sides of a dual-output miter [default = %s]\n"
                  ,pcVar6);
        pcVar6 = "yes";
        if (!bVar2) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-t     : write files with two sides of a two-word miter [default = %s]\n",
                  pcVar6);
        pcVar6 = "yes";
        if (!bVar3) {
          pcVar6 = "no";
        }
        Abc_Print(-2,"\t-d     : take single-output and decompose into dual-output [default = %s]\n"
                  ,pcVar6);
        if (local_824 == 0) {
          pcVar7 = "no";
        }
        Abc_Print(-2,"\t-v     : toggles printing verbose information [default = %s]\n",pcVar7);
        Abc_Print(-2,"\t-h     : print the command usage\n");
        return 1;
      case 8:
        bVar2 = (bool)(bVar2 ^ 1);
        break;
      case 9:
        local_824 = local_824 ^ 1;
      }
      iVar4 = Extra_UtilGetopt(argc,argv,"ftdvh");
      pAbc = local_810;
    } while (iVar4 != -1);
    pGVar5 = local_810->pGia;
    if (pGVar5 != (Gia_Man_t *)0x0) {
      if (bVar1 || bVar2) {
        memcpy(local_418,"miter_part0.aig",1000);
        memcpy(local_808,"miter_part1.aig",1000);
        if ((pGVar5->vCos->nSize - pGVar5->nRegs & 1U) == 0) {
          if (bVar2) {
            Gia_ManDemiterTwoWords(pGVar5,&local_818,&local_820);
          }
          else {
            Gia_ManDemiterDual(pGVar5,&local_818,&local_820);
          }
          pcVar6 = pAbc->pGia->pSpec;
          if (pcVar6 != (char *)0x0) {
            pcVar6 = Extra_FileNameGeneric(pcVar6);
            sprintf(local_418,"%s_1.aig",pcVar6);
            sprintf(local_808,"%s_2.aig",pcVar6);
            if (pcVar6 != (char *)0x0) {
              free(pcVar6);
            }
          }
          Gia_AigerWrite(local_818,local_418,0,0,0);
          Gia_AigerWrite(local_820,local_808,0,0,0);
          Gia_ManStop(local_818);
          Gia_ManStop(local_820);
          if (bVar2) {
            pcVar6 = "Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n";
          }
          else {
            pcVar6 = "Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n"
            ;
          }
          printf(pcVar6,local_418,local_808);
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n");
        return 0;
      }
      if (pGVar5->vCos->nSize - pGVar5->nRegs != 1) {
LAB_00290c6d:
        pcVar6 = "Abc_CommandAbc9Demiter(): Miter should have one output.\n";
        goto LAB_00290c74;
      }
      if (bVar3) {
        pGVar5 = Gia_ManDemiterToDual(pGVar5);
        goto LAB_00290c46;
      }
LAB_00290c0f:
      pGVar5 = Gia_ManDupDemiter(pGVar5,local_824);
LAB_00290c46:
      Abc_FrameUpdateGia(pAbc,pGVar5);
      if (local_824 == 0) {
        return 0;
      }
      Gia_ManPrintStatsMiter(pGVar5,0);
      return 0;
    }
  }
  pcVar6 = "Abc_CommandAbc9Demiter(): There is no AIG.\n";
LAB_00290c74:
  Abc_Print(-1,pcVar6);
  return 0;
}

Assistant:

int Abc_CommandAbc9Demiter( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, fDumpFiles = 0, fDumpFilesTwo = 0, fDual = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ftdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fDumpFiles ^= 1;
            break;
        case 't':
            fDumpFilesTwo ^= 1;
            break;
        case 'd':
            fDual ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): There is no AIG.\n" );
        return 0;
    }
    if ( fDumpFiles || fDumpFilesTwo )
    {
        char pName0[1000] = "miter_part0.aig";
        char pName1[1000] = "miter_part1.aig";
        Gia_Man_t * pPart1, * pPart2;
        if ( Gia_ManPoNum(pAbc->pGia) % 2 != 0 )
        {
            Abc_Print( -1, "Abc_CommandAbc9Demiter(): Does not look like a dual-output miter.\n" );
            return 0;
        }
        if ( fDumpFilesTwo )
            Gia_ManDemiterTwoWords( pAbc->pGia, &pPart1, &pPart2 );
        else
            Gia_ManDemiterDual( pAbc->pGia, &pPart1, &pPart2 );
        if ( pAbc->pGia->pSpec )
        {
            char * pGen = Extra_FileNameGeneric(pAbc->pGia->pSpec);
            sprintf( pName0, "%s_1.aig", pGen );
            sprintf( pName1, "%s_2.aig", pGen );
            ABC_FREE( pGen );
        }
        Gia_AigerWrite( pPart1, pName0, 0, 0, 0 );
        Gia_AigerWrite( pPart2, pName1, 0, 0, 0 );
        Gia_ManStop( pPart1 );
        Gia_ManStop( pPart2 );
        if ( fDumpFilesTwo )
            printf( "Two parts of the two-word miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        else
            printf( "Two parts of the dual-output miter are dumped into files \"%s\" and \"%s\".\n", pName0, pName1 );
        return 0;
    }
    if ( Gia_ManPoNum(pAbc->pGia) != 1 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Demiter(): Miter should have one output.\n" );
        return 0;
    }
    if ( fDual )
        pTemp = Gia_ManDemiterToDual( pAbc->pGia );
    else
        pTemp = Gia_ManDupDemiter( pAbc->pGia, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    if ( fVerbose )
        Gia_ManPrintStatsMiter( pTemp, 0 );
    return 0;

usage:
    Abc_Print( -2, "usage: &demiter [-ftdvh]\n" );
    Abc_Print( -2, "\t         decomposes a miter (by default, tries to extract an OR gate)\n" );
    Abc_Print( -2, "\t-f     : write files with two sides of a dual-output miter [default = %s]\n",  fDumpFiles? "yes": "no" );
    Abc_Print( -2, "\t-t     : write files with two sides of a two-word miter [default = %s]\n",  fDumpFilesTwo? "yes": "no" );
    Abc_Print( -2, "\t-d     : take single-output and decompose into dual-output [default = %s]\n",  fDual? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggles printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}